

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_table_entry.cpp
# Opt level: O3

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::DuckTableEntry::SetColumnComment
          (DuckTableEntry *this,ClientContext *context,SetColumnCommentInfo *info)

{
  __node_base *__ht;
  _Hash_node_base *p_Var1;
  SchemaCatalogEntry *pSVar2;
  pointer pCVar3;
  Catalog *catalog;
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> _Var4;
  CreateTableInfo *this_00;
  pointer pCVar5;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  LogicalIndex LVar6;
  ColumnDefinition *this_02;
  reference this_03;
  pointer pCVar7;
  Binder *info_00;
  type info_01;
  DuckTableEntry *this_04;
  CatalogException *this_05;
  _Hash_node_base *in_RCX;
  size_type __n;
  ColumnListIterator CVar8;
  shared_ptr<duckdb::Binder,_true> binder;
  ColumnDefinition copy;
  _Head_base<0UL,_duckdb::CreateTableInfo_*,_false> local_248;
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  ClientContext *local_220;
  __node_base local_218;
  element_type *local_210;
  __node_base local_208;
  ClientContext *local_200;
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> local_1f8;
  ClientContext *local_1f0;
  __node_base_ptr local_1e8;
  undefined1 local_1e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  LogicalType local_1c0;
  __node_base local_1a8;
  undefined8 uStack_197;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_188;
  Value local_180;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  a_Stack_140 [56];
  undefined1 local_108 [88];
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_b0;
  Value local_a8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68 [56];
  
  pSVar2 = *(SchemaCatalogEntry **)&(context->config).query_verification_enabled;
  local_208._M_nxt = in_RCX;
  local_1f8._M_head_impl = (CatalogEntry *)this;
  local_1f0 = (ClientContext *)info;
  this_00 = (CreateTableInfo *)operator_new(0x1d8);
  p_Var1 = (_Hash_node_base *)(local_1e0 + 0x10);
  local_1e0._0_8_ = p_Var1;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_1e0,*(long *)&context->interrupted,
             (long)&(((context->registered_state).
                      super_unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
                      .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>._M_head_impl)
                    ->lock).super___mutex_base._M_mutex + *(long *)&context->interrupted);
  CreateTableInfo::CreateTableInfo(this_00,pSVar2,(string *)local_1e0);
  local_248._M_head_impl = this_00;
  if ((_Hash_node_base *)local_1e0._0_8_ != p_Var1) {
    operator_delete((void *)local_1e0._0_8_);
  }
  pCVar5 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_248);
  Value::operator=(&(pCVar5->super_CreateInfo).comment,
                   (Value *)((long)&(context->config).home_directory.field_2 + 8));
  pCVar5 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_248);
  __ht = &(context->config).profiler_settings._M_h._M_before_begin;
  this_01 = &(pCVar5->super_CreateInfo).tags;
  if ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *)__ht != this_01) {
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)this_01,
               (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)__ht);
  }
  LVar6 = TableCatalogEntry::GetColumnIndex
                    ((TableCatalogEntry *)context,(string *)(local_208._M_nxt + 0xf),false);
  if (LVar6.index != 0xffffffffffffffff) {
    CVar8 = ColumnList::Logical((ColumnList *)&(context->config).asof_loop_join_threshold);
    local_230._0_8_ = CVar8.list;
    local_230[8] = CVar8.physical;
    if (((undefined1  [16])CVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      pCVar3 = (((vector<duckdb::ColumnDefinition,_true> *)
                &((element_type *)local_230._0_8_)->super_enable_shared_from_this<duckdb::Binder>)->
               super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>).
               super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_218._M_nxt =
           (_Hash_node_base *)
           (((long)pCVar3 -
             (long)(((vector<duckdb::ColumnDefinition,_true> *)
                    &((element_type *)local_230._0_8_)->
                     super_enable_shared_from_this<duckdb::Binder>)->
                   super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                   ).
                   super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed);
      local_200 = (ClientContext *)
                  (((long)pCVar3 -
                    (long)(((vector<duckdb::ColumnDefinition,_true> *)
                           &((element_type *)local_230._0_8_)->
                            super_enable_shared_from_this<duckdb::Binder>)->
                          super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          ).
                          super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed);
    }
    else {
      local_218._M_nxt =
           (_Hash_node_base *)
           ((long)(((element_type *)local_230._0_8_)->bound_ctes)._M_h._M_bucket_count -
            (long)(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                   &(((element_type *)local_230._0_8_)->bound_ctes)._M_h._M_buckets)->_M_impl).
                  super__Vector_impl_data._M_start >> 3);
      local_200 = (ClientContext *)local_218._M_nxt;
    }
    local_220 = (ClientContext *)0x0;
    local_208._M_nxt = local_208._M_nxt + 0x13;
    local_210 = (element_type *)local_230._0_8_;
    local_1e8 = (__node_base_ptr)LVar6;
    while (((local_220 != local_200 || ((ClientContext *)local_218._M_nxt != local_200)) ||
           ((element_type *)local_230._0_8_ != local_210))) {
      this_02 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                          ((ColumnLogicalIteratorInternal *)local_230);
      ColumnDefinition::Copy((ColumnDefinition *)local_1e0,this_02);
      LVar6 = ColumnDefinition::Logical(this_02);
      if (local_1e8 == (__node_base_ptr)LVar6.index) {
        ColumnDefinition::SetComment((ColumnDefinition *)local_1e0,(Value *)local_208._M_nxt);
      }
      pCVar5 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
               ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                             *)&local_248);
      if ((_Hash_node_base *)local_1e0._0_8_ == (_Hash_node_base *)(local_1e0 + 0x10)) {
        local_108._24_8_ = local_1d0._8_8_;
        local_108._0_8_ = local_108 + 0x10;
      }
      else {
        local_108._0_8_ = local_1e0._0_8_;
      }
      local_108._17_7_ = local_1d0._M_allocated_capacity._1_7_;
      local_108[0x10] = local_1d0._M_local_buf[0];
      local_108._8_8_ = local_1e0._8_8_;
      local_1e0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1d0._M_local_buf[0] = '\0';
      local_1e0._0_8_ = (_Hash_node_base *)(local_1e0 + 0x10);
      LogicalType::LogicalType((LogicalType *)(local_108 + 0x20),(LogicalType *)(local_1e0 + 0x20));
      local_108._73_8_ = uStack_197;
      local_108._56_8_ = local_1a8._M_nxt;
      local_b0._M_head_impl = local_188._M_head_impl;
      local_188._M_head_impl = (ParsedExpression *)0x0;
      Value::Value(&local_a8,&local_180);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Hashtable(local_68,a_Stack_140,a_Stack_140);
      ColumnList::AddColumn(&pCVar5->columns,(ColumnDefinition *)local_108);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(local_68);
      Value::~Value(&local_a8);
      if (local_b0._M_head_impl != (ParsedExpression *)0x0) {
        (*((local_b0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_b0._M_head_impl = (ParsedExpression *)0x0;
      LogicalType::~LogicalType((LogicalType *)(local_108 + 0x20));
      if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
        operator_delete((void *)local_108._0_8_);
      }
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(a_Stack_140);
      Value::~Value(&local_180);
      if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           )local_188._M_head_impl != (ParsedExpression *)0x0) {
        (**(code **)(*(long *)local_188._M_head_impl + 8))();
      }
      local_188._M_head_impl = (ParsedExpression *)0x0;
      LogicalType::~LogicalType((LogicalType *)(local_1e0 + 0x20));
      if ((_Hash_node_base *)local_1e0._0_8_ != (_Hash_node_base *)(local_1e0 + 0x10)) {
        operator_delete((void *)local_1e0._0_8_);
      }
      local_220 = (ClientContext *)
                  ((long)&(local_220->super_enable_shared_from_this<duckdb::ClientContext>).
                          __weak_this_.internal.
                          super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  + 1);
    }
    if ((context->config).set_variables._M_h._M_single_bucket !=
        (__node_base_ptr)(context->config).set_variables._M_h._M_rehash_policy._M_next_resize) {
      __n = 0;
      do {
        this_03 = vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
                  ::operator[]((vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
                                *)&(context->config).set_variables._M_h._M_rehash_policy.
                                   _M_next_resize,__n);
        pCVar7 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                 operator->(this_03);
        (*pCVar7->_vptr_Constraint[3])
                  ((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
                   local_1e0,pCVar7);
        pCVar5 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                 ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                               *)&local_248);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
                    *)&pCVar5->constraints,
                   (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
                   local_1e0);
        if ((_Hash_node_base *)local_1e0._0_8_ != (_Hash_node_base *)0x0) {
          (*(code *)(*(_Hash_node_base **)local_1e0._0_8_)[1]._M_nxt)();
        }
        __n = __n + 1;
      } while (__n < (ulong)((long)((long)(context->config).set_variables._M_h._M_single_bucket -
                                   (context->config).set_variables._M_h._M_rehash_policy.
                                   _M_next_resize) >> 3));
    }
    Binder::CreateBinder
              ((Binder *)local_230,local_1f0,(optional_ptr<duckdb::Binder,_true>)0x0,REGULAR_BINDER)
    ;
    info_00 = shared_ptr<duckdb::Binder,_true>::operator->
                        ((shared_ptr<duckdb::Binder,_true> *)local_230);
    local_240._8_8_ = local_248._M_head_impl;
    local_248._M_head_impl = (CreateTableInfo *)0x0;
    Binder::BindCreateTableInfo
              ((Binder *)local_240,
               (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
               info_00,(SchemaCatalogEntry *)(local_240 + 8));
    if ((CreateTableInfo *)local_240._8_8_ != (CreateTableInfo *)0x0) {
      (*(((CreateInfo *)local_240._8_8_)->super_ParseInfo)._vptr_ParseInfo[1])();
    }
    local_240._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    catalog = (Catalog *)(context->config).max_expression_depth;
    pSVar2 = *(SchemaCatalogEntry **)&(context->config).query_verification_enabled;
    info_01 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
              ::operator*((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                           *)local_240);
    this_04 = (DuckTableEntry *)operator_new(0x298);
    local_1e0._0_8_ = (context->config).user_variables._M_h._M_bucket_count;
    local_1e0._8_8_ = (context->config).user_variables._M_h._M_before_begin._M_nxt;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._8_8_)->_M_use_count + 1;
      }
    }
    DuckTableEntry(this_04,catalog,pSVar2,info_01,(shared_ptr<duckdb::DataTable,_true> *)local_1e0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._8_8_);
    }
    _Var4._M_head_impl = local_1f8._M_head_impl;
    (local_1f8._M_head_impl)->_vptr_CatalogEntry = (_func_int **)this_04;
    if ((element_type *)local_240._0_8_ != (element_type *)0x0) {
      ::std::default_delete<duckdb::BoundCreateTableInfo>::operator()
                ((default_delete<duckdb::BoundCreateTableInfo> *)local_240,
                 (BoundCreateTableInfo *)local_240._0_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_230._9_7_,local_230[8]) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 CONCAT71(local_230._9_7_,local_230[8]));
    }
    if (local_248._M_head_impl != (CreateTableInfo *)0x0) {
      (*((local_248._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
    }
    return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
           (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
           _Var4._M_head_impl;
  }
  this_05 = (CatalogException *)__cxa_allocate_exception(0x10);
  local_1e0._0_8_ = p_Var1;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e0,"Cannot SET DEFAULT for rowid column","");
  CatalogException::CatalogException(this_05,(string *)local_1e0);
  __cxa_throw(this_05,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<CatalogEntry> DuckTableEntry::SetColumnComment(ClientContext &context, SetColumnCommentInfo &info) {
	auto create_info = make_uniq<CreateTableInfo>(schema, name);
	create_info->comment = comment;
	create_info->tags = tags;
	auto default_idx = GetColumnIndex(info.column_name);
	if (default_idx.index == COLUMN_IDENTIFIER_ROW_ID) {
		throw CatalogException("Cannot SET DEFAULT for rowid column");
	}

	// Copy all the columns, changing the value of the one that was specified by 'column_name'
	for (auto &col : columns.Logical()) {
		auto copy = col.Copy();
		if (default_idx == col.Logical()) {
			copy.SetComment(info.comment_value);
		}
		create_info->columns.AddColumn(std::move(copy));
	}
	// Copy all the constraints
	for (idx_t i = 0; i < constraints.size(); i++) {
		auto constraint = constraints[i]->Copy();
		create_info->constraints.push_back(std::move(constraint));
	}

	auto binder = Binder::CreateBinder(context);
	auto bound_create_info = binder->BindCreateTableInfo(std::move(create_info), schema);
	return make_uniq<DuckTableEntry>(catalog, schema, *bound_create_info, storage);
}